

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseFrexp::test(ShaderBitfieldOperationCaseFrexp *this,Data *data)

{
  float fVar1;
  float fVar2;
  int local_24;
  float result;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseFrexp *this_local;
  
  local_24 = 0;
  do {
    if (this->m_components <= local_24) {
      return true;
    }
    if ((data->inVec4[local_24] != 0.0) || (NAN(data->inVec4[local_24]))) {
      fVar2 = deFloatAbs(data->outVec4[local_24]);
      if ((fVar2 < 0.5) || (fVar2 = deFloatAbs(data->outVec4[local_24]), 1.0 <= fVar2)) {
        return false;
      }
    }
    else if (((data->outVec4[local_24] != 0.0) || (NAN(data->outVec4[local_24]))) ||
            (data->outIvec4[local_24] != 0)) {
      return false;
    }
    fVar2 = data->outVec4[local_24];
    fVar1 = deFloatPow(2.0,(float)data->outIvec4[local_24]);
    fVar2 = deFloatAbs(fVar2 * fVar1 - data->inVec4[local_24]);
    if (0.0001 < fVar2) {
      return false;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			if (data->inVec4[i] == 0.0)
			{
				if (data->outVec4[i] != 0.0 || data->outIvec4[i] != 0)
				{
					return false;
				}
			}
			else if (deFloatAbs(data->outVec4[i]) < 0.5 || deFloatAbs(data->outVec4[i]) >= 1.0)
			{
				return false;
			}

			float result = data->outVec4[i] * deFloatPow(2.0, (float)data->outIvec4[i]);
			if (deFloatAbs(result - data->inVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}